

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O3

void __thiscall sc_dt::sc_uint_subref::concat_set(sc_uint_subref *this,sc_signed *src,int low_i)

{
  byte bVar1;
  sc_uint_base *psVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  sc_uint_base local_50;
  sc_signed local_38;
  
  iVar4 = (this->super_sc_uint_subref_r).m_left - (this->super_sc_uint_subref_r).m_right;
  local_50.m_len = iVar4 + 1;
  local_50.super_sc_value_base._vptr_sc_value_base = (_func_int **)&PTR_concat_clear_data_0026c4c8;
  local_50.m_val = 0;
  iVar6 = 0x3f - iVar4;
  local_50.m_ulen = iVar6;
  if (0xffffffbf < iVar4 - 0x40U) {
    if (low_i < src->nbits) {
      sc_dt::operator>>(&local_38,src,(long)low_i);
      sc_uint_base::operator=(&local_50,&local_38);
      psVar2 = (this->super_sc_uint_subref_r).m_obj_p;
      iVar4 = (this->super_sc_uint_subref_r).m_right;
      uVar5 = local_50.m_val << ((byte)iVar4 & 0x3f);
      bVar1 = (byte)psVar2->m_ulen;
      psVar2->m_val =
           (((psVar2->m_val ^ uVar5) &
             *(ulong *)(mask_int +
                       (long)iVar4 * 8 + (long)(this->super_sc_uint_subref_r).m_left * 0x200) ^
            uVar5) << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
      local_38.super_sc_value_base._vptr_sc_value_base =
           (_func_int **)&PTR_concat_clear_data_0026c2b0;
      if (local_38.digit != (sc_digit *)0x0) {
        operator_delete__(local_38.digit);
      }
    }
    else {
      bVar3 = sc_dt::operator<(src,0);
      uVar5 = 0xffffffffffffffff >> ((byte)iVar6 & 0x3f);
      if (!bVar3) {
        uVar5 = 0;
      }
      psVar2 = (this->super_sc_uint_subref_r).m_obj_p;
      iVar4 = (this->super_sc_uint_subref_r).m_right;
      uVar5 = uVar5 << ((byte)iVar4 & 0x3f);
      bVar1 = (byte)psVar2->m_ulen;
      psVar2->m_val =
           (((psVar2->m_val ^ uVar5) &
             *(ulong *)(mask_int +
                       (long)iVar4 * 8 + (long)(this->super_sc_uint_subref_r).m_left * 0x200) ^
            uVar5) << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
    }
    return;
  }
  sc_uint_base::invalid_length(&local_50);
}

Assistant:

void sc_uint_subref::concat_set(const sc_signed& src, int low_i)
{
    sc_uint_base aa( length() );
    if ( low_i < src.length() )
        *this = aa = src >> low_i;
    else
        *this = aa = (src < 0) ? (int_type)-1 : 0;
}